

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cpp
# Opt level: O2

void __thiscall FFT_Multiplies_Test::~FFT_Multiplies_Test(FFT_Multiplies_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(FFT, Multiplies) {
    rep(i, 0, 30) {
        vector<ll> p1(30 + rand() % 30), p2(30 + rand() % 30);
        rep(j, 0, p1.size()) p1[j] = rand() % 20000000 - 10000000;
        rep(j, 0, p2.size()) p2[j] = rand() % 20000000 - 10000000;
        vector<ll> want = multiplyNaive(p1, p2);
        EXPECT_EQ(want, multiplyPolynomials(p1, p2));
    }
}